

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::processElements
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *baseTypeInfo,
          ComplexTypeInfo *newTypeInfo)

{
  uint key3;
  uint uVar1;
  uint uVar2;
  SchemaInfo *pSVar3;
  SchemaGrammar *pSVar4;
  ulong uVar5;
  SchemaElementDecl **ppSVar6;
  GrammarResolver *this_00;
  XMLCh *text1;
  MemoryManager *pMVar7;
  QName *pQVar8;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *this_01;
  XMLSize_t XVar9;
  uint uVar10;
  int iVar11;
  XMLSize_t index;
  SchemaElementDecl *valueToAdopt;
  undefined4 extraout_var;
  Grammar *pGVar12;
  undefined4 extraout_var_00;
  RefVectorOf<xercesc_4_0::SchemaElementDecl> *pRVar13;
  undefined4 extraout_var_01;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  XMLSize_t XVar17;
  XMLSize_t getAt;
  bool bVar18;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar3 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  if (baseTypeInfo->fElements == (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
    XVar17 = 0;
  }
  else {
    XVar17 = (baseTypeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).
             fCurCount;
  }
  local_40.fSchemaInfo = pSVar3;
  if (XVar17 != 0) {
    key3 = newTypeInfo->fScopeDefined;
    uVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
    getAt = 0;
    do {
      pSVar4 = this->fSchemaGrammar;
      if (&baseTypeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> ==
          (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
        valueToAdopt = (SchemaElementDecl *)0x0;
      }
      else {
        valueToAdopt = BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::elementAt
                                 (&baseTypeInfo->fElements->
                                   super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>,getAt);
      }
      uVar1 = valueToAdopt->fEnclosingScope;
      if (uVar1 == 0xfffffffe) {
LAB_0033c975:
        pRVar13 = newTypeInfo->fElements;
        if (pRVar13 == (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
          pRVar13 = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)
                    XMemory::operator_new(0x30,newTypeInfo->fMemoryManager);
          pMVar7 = newTypeInfo->fMemoryManager;
          (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
               (_func_int **)&PTR__BaseRefVectorOf_00416108;
          (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fAdoptedElems = false;
          (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount = 0;
          (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMaxCount = 8;
          (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
               (SchemaElementDecl **)0x0;
          (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMemoryManager = pMVar7;
          iVar11 = (*pMVar7->_vptr_MemoryManager[3])(pMVar7,0x40);
          (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
               (SchemaElementDecl **)CONCAT44(extraout_var_01,iVar11);
          lVar14 = 0;
          do {
            (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList[lVar14] =
                 (SchemaElementDecl *)0x0;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
               (_func_int **)&PTR__RefVectorOf_00416090;
          newTypeInfo->fElements = pRVar13;
        }
        else {
          uVar5 = (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount;
          bVar18 = uVar5 != 0;
          if (bVar18) {
            ppSVar6 = (pRVar13->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList;
            if (*ppSVar6 == valueToAdopt) goto LAB_0033cb7b;
            uVar15 = 0;
            do {
              uVar16 = uVar5;
              if (uVar5 - 1 == uVar15) break;
              uVar16 = uVar15 + 1;
              lVar14 = uVar15 + 1;
              uVar15 = uVar16;
            } while (ppSVar6[lVar14] != valueToAdopt);
            bVar18 = uVar16 < uVar5;
          }
          if (bVar18) goto LAB_0033cb7b;
        }
        this_01 = &newTypeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
        BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(this_01,1);
        XVar9 = this_01->fCurCount;
        this_01->fElemList[XVar9] = valueToAdopt;
        this_01->fCurCount = XVar9 + 1;
      }
      else {
        uVar2 = ((valueToAdopt->super_XMLElementDecl).fElementName)->fURIId;
        if (((uVar2 == uVar10) || (uVar2 == this->fTargetNSURI)) ||
           (uVar2 == this->fEmptyNamespaceURI)) {
LAB_0033ca26:
          text1 = ((valueToAdopt->super_XMLElementDecl).fElementName)->fLocalPart;
          iVar11 = (*(pSVar4->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                             (pSVar4,(ulong)uVar2,text1,0,(ulong)key3);
          lVar14 = CONCAT44(extraout_var_00,iVar11);
          if (lVar14 == 0) {
            valueToAdopt->fEnclosingScope = key3;
            pQVar8 = (valueToAdopt->super_XMLElementDecl).fElementName;
            RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                      (pSVar4->fGroupElemDeclPool,pQVar8->fLocalPart,pQVar8->fURIId,key3,
                       valueToAdopt);
            valueToAdopt->fEnclosingScope = uVar1;
          }
          else if ((valueToAdopt->fComplexTypeInfo != *(ComplexTypeInfo **)(lVar14 + 0x50)) ||
                  (valueToAdopt->fDatatypeValidator != *(DatatypeValidator **)(lVar14 + 0x78))) {
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x43,text1,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          if (lVar14 == 0) goto LAB_0033c975;
        }
        else {
          this_00 = this->fGrammarResolver;
          iVar11 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                             (this->fURIStringPool,(ulong)uVar2);
          pGVar12 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar11));
          if ((pGVar12 != (Grammar *)0x0) &&
             (iVar11 = (*(pGVar12->super_XSerializable)._vptr_XSerializable[5])(pGVar12),
             iVar11 == 1)) goto LAB_0033ca26;
        }
      }
LAB_0033cb7b:
      getAt = getAt + 1;
    } while (getAt != XVar17);
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::processElements(const DOMElement* const elem,
                                     ComplexTypeInfo* const baseTypeInfo,
                                     ComplexTypeInfo* const newTypeInfo) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    XMLSize_t elemCount = baseTypeInfo->elementCount();

    if (elemCount) {

        int newTypeScope = newTypeInfo->getScopeDefined();
        int schemaURI = fURIStringPool->addOrFind(SchemaSymbols::fgURI_SCHEMAFORSCHEMA);

        for (XMLSize_t i=0; i < elemCount; i++) {

            SchemaGrammar*     aGrammar = fSchemaGrammar;
            SchemaElementDecl* elemDecl = baseTypeInfo->elementAt(i);
            int elemURI = elemDecl->getURI();
            unsigned int elemScope = elemDecl->getEnclosingScope();

            if (elemScope != Grammar::TOP_LEVEL_SCOPE) {

                if (elemURI != fTargetNSURI && elemURI != schemaURI && elemURI != fEmptyNamespaceURI) {
                    Grammar* aGrammar = fGrammarResolver->getGrammar(fURIStringPool->getValueForId(elemURI));

                    if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {
                        continue; // REVISIT - error message
                    }
                }

                const XMLCh*             localPart = elemDecl->getBaseName();
                const SchemaElementDecl* other = (SchemaElementDecl*)
                    aGrammar->getElemDecl(elemURI, localPart, 0, newTypeScope);

                if (other) {

                    if (elemDecl->getComplexTypeInfo() != other->getComplexTypeInfo()
                        || elemDecl->getDatatypeValidator() != other->getDatatypeValidator()) {
                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, localPart);
                    }

                    continue;
                }
                elemDecl->setEnclosingScope(newTypeScope);
                ((SchemaGrammar*) aGrammar)->putGroupElemDecl(elemDecl);
                elemDecl->setEnclosingScope(elemScope);
            }

            newTypeInfo->addElement(elemDecl);
        }
    }
}